

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::createBlockBasicTypeCases
               (TestCaseGroup *group,TestContext *testCtx,string *name,VarType *type,
               deUint32 layoutFlags,int numInstances)

{
  string *psVar1;
  TestContext *pTVar2;
  TestNode *pTVar3;
  allocator<char> local_1e9;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a2;
  allocator<char> local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  deUint32 local_2c;
  int numInstances_local;
  deUint32 layoutFlags_local;
  VarType *type_local;
  string *name_local;
  TestContext *testCtx_local;
  TestCaseGroup *group_local;
  
  local_30 = numInstances;
  local_2c = layoutFlags;
  _numInstances_local = type;
  type_local = (VarType *)name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)group;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  local_82 = 1;
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_vertex");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_50,&local_80,
             _numInstances_local,local_2c | 0x200,local_30,LOAD_FULL_MATRIX);
  local_82 = 0;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar2 = testCtx_local;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  local_ca = 1;
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_fragment");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_a8,&local_c8,
             _numInstances_local,local_2c | 0x400,local_30,LOAD_FULL_MATRIX);
  local_ca = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a8);
  pTVar2 = testCtx_local;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  local_112 = 1;
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_both");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_f0,&local_110,
             _numInstances_local,local_2c | 0x600,local_30,LOAD_FULL_MATRIX);
  local_112 = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_f0);
  pTVar2 = testCtx_local;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  local_15a = 1;
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_vertex_comp_access");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_138,&local_158,
             _numInstances_local,local_2c | 0x200,local_30,LOAD_MATRIX_COMPONENTS);
  local_15a = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_138);
  pTVar2 = testCtx_local;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  local_1a2 = 1;
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_fragment_comp_access");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_180,&local_1a0,
             _numInstances_local,local_2c | 0x400,local_30,LOAD_MATRIX_COMPONENTS);
  local_1a2 = 0;
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_180);
  pTVar2 = testCtx_local;
  pTVar3 = (TestNode *)operator_new(0x168);
  psVar1 = name_local;
  std::operator+(&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local,
                 "_both_comp_access");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"",&local_1e9);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar3,(TestContext *)psVar1,&local_1c8,&local_1e8,
             _numInstances_local,local_2c | 0x600,local_30,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild((TestNode *)pTVar2,pTVar3);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, tcu::TestContext& testCtx, const std::string& name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex",			"", type, layoutFlags|DECLARE_VERTEX,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment",			"", type, layoutFlags|DECLARE_FRAGMENT,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both",				"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,		numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex_comp_access",		"", type, layoutFlags|DECLARE_VERTEX,				numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment_comp_access",	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both_comp_access",		"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances, LOAD_MATRIX_COMPONENTS));
}